

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
::Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
        *this)

{
  bool bVar1;
  size_t sVar2;
  iterator __end0;
  iterator __begin0;
  OUT OStack_248;
  iterator local_228;
  iterator local_180;
  iterator local_d8;
  
  begin(&local_180,this);
  end(&local_228,this);
  sVar2 = 0;
  while( true ) {
    iterator::iterator(&local_d8,&local_228);
    bVar1 = iterator::operator!=(&local_180,&local_d8);
    GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
    ::~GroupByState(&local_d8.source);
    if (!bVar1) break;
    GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
    ::Current(&OStack_248,&local_180.source);
    sVar2 = sVar2 + 1;
    IEnumerable<int_&>::~IEnumerable(&OStack_248.super_IEnumerable<int_&>);
    iterator::operator++(&local_180);
  }
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  ::~GroupByState(&local_228.source);
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  ::~GroupByState(&local_180.source);
  return sVar2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}